

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_predicate_for_stream_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int iVar2;
  
  if (stream != (nghttp2_stream *)0x0) {
    iVar1 = session_is_closing(session);
    iVar2 = -0x212;
    if (iVar1 == 0) {
      iVar2 = (uint)((stream->shut_flags & 2) == 0) * 0x200 + -0x200;
    }
    return iVar2;
  }
  return -0x1fe;
}

Assistant:

static int session_predicate_for_stream_send(nghttp2_session *session,
                                             nghttp2_stream *stream) {
  if (stream == NULL) {
    return NGHTTP2_ERR_STREAM_CLOSED;
  }
  if (session_is_closing(session)) {
    return NGHTTP2_ERR_SESSION_CLOSING;
  }
  if (stream->shut_flags & NGHTTP2_SHUT_WR) {
    return NGHTTP2_ERR_STREAM_SHUT_WR;
  }
  return 0;
}